

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O1

Input_Port * __thiscall
Input_Port::Search(Input_Port *this,Am_Object_Advanced *object,Am_Slot_Key key)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Object local_30;
  
  do {
    Am_Slot::Get_Owner((Am_Slot *)&local_30);
    bVar1 = Am_Object::operator==(&local_30,&object->super_Am_Object);
    if (bVar1) {
      AVar2 = Am_Slot::Get_Key(&this->context);
      Am_Object::~Am_Object(&local_30);
      if (AVar2 == key) {
        return this;
      }
    }
    else {
      Am_Object::~Am_Object(&local_30);
    }
    this = this->next;
  } while (this != (Input_Port *)0x0);
  return (Input_Port *)0x0;
}

Assistant:

Input_Port *Search(const Am_Object_Advanced &object, Am_Slot_Key key)
  {
    Input_Port *curr;
    for (curr = this; curr; curr = curr->next)
      if ((curr->context.Get_Owner() == object) &&
          (curr->context.Get_Key() == key))
        return curr;
    return nullptr;
  }